

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::read_dqt_marker(jpeg_decoder *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  jpgd_quant_t *pjVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  ushort uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  
  iVar5 = this->m_bits_left;
  uVar14 = this->m_bit_buf;
  this->m_bits_left = iVar5 + -0x10;
  if (0x10 < iVar5) {
    this->m_bit_buf = uVar14 << 0x10;
    goto LAB_0011d929;
  }
  this->m_bit_buf = uVar14 << ((byte)iVar5 & 0x1f);
  iVar5 = this->m_in_buf_left;
  if (iVar5 == 0) {
    prep_in_buffer(this);
    iVar5 = this->m_in_buf_left;
    if (iVar5 != 0) goto LAB_0011d87e;
    uVar12 = this->m_tem_flag;
    this->m_tem_flag = uVar12 ^ 1;
    uVar6 = 0xd9;
    if (uVar12 == 0) {
      uVar6 = 0xff;
    }
LAB_0011d8ca:
    prep_in_buffer(this);
    iVar5 = this->m_in_buf_left;
    if (iVar5 != 0) {
      pbVar10 = this->m_pIn_buf_ofs;
      goto LAB_0011d8e7;
    }
    uVar8 = this->m_tem_flag;
    this->m_tem_flag = uVar8 ^ 1;
    uVar12 = 0xd9;
    if (uVar8 == 0) {
      uVar12 = 0xff;
    }
  }
  else {
LAB_0011d87e:
    pbVar4 = this->m_pIn_buf_ofs;
    pbVar10 = pbVar4 + 1;
    this->m_pIn_buf_ofs = pbVar10;
    uVar6 = (uint)*pbVar4;
    iVar5 = iVar5 + -1;
    this->m_in_buf_left = iVar5;
    if (iVar5 == 0) goto LAB_0011d8ca;
LAB_0011d8e7:
    this->m_pIn_buf_ofs = pbVar10 + 1;
    bVar1 = *pbVar10;
    this->m_in_buf_left = iVar5 + -1;
    uVar12 = (uint)bVar1;
  }
  this->m_bit_buf =
       (uVar6 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar12) <<
       (-(char)this->m_bits_left & 0x1fU);
  this->m_bits_left = this->m_bits_left + 0x10;
LAB_0011d929:
  if (uVar14 < 0x20000) {
    stop_decoding(this,JPGD_BAD_DQT_MARKER);
  }
  uVar14 = (uVar14 >> 0x10) - 2;
  do {
    if (uVar14 == 0) {
      return;
    }
    iVar5 = this->m_bits_left;
    uVar6 = this->m_bit_buf;
    this->m_bits_left = iVar5 + -8;
    if (iVar5 < 9) {
      this->m_bit_buf = uVar6 << ((byte)iVar5 & 0x1f);
      iVar5 = this->m_in_buf_left;
      if (iVar5 == 0) {
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 != 0) goto LAB_0011d986;
        uVar8 = this->m_tem_flag;
        this->m_tem_flag = uVar8 ^ 1;
        uVar12 = 0xd9;
        if (uVar8 == 0) {
          uVar12 = 0xff;
        }
LAB_0011d9d2:
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 != 0) {
          pbVar10 = this->m_pIn_buf_ofs;
          goto LAB_0011d9ef;
        }
        uVar15 = this->m_tem_flag;
        this->m_tem_flag = uVar15 ^ 1;
        uVar8 = 0xd9;
        if (uVar15 == 0) {
          uVar8 = 0xff;
        }
      }
      else {
LAB_0011d986:
        pbVar4 = this->m_pIn_buf_ofs;
        pbVar10 = pbVar4 + 1;
        this->m_pIn_buf_ofs = pbVar10;
        uVar12 = (uint)*pbVar4;
        iVar5 = iVar5 + -1;
        this->m_in_buf_left = iVar5;
        if (iVar5 == 0) goto LAB_0011d9d2;
LAB_0011d9ef:
        this->m_pIn_buf_ofs = pbVar10 + 1;
        bVar1 = *pbVar10;
        this->m_in_buf_left = iVar5 + -1;
        uVar8 = (uint)bVar1;
      }
      this->m_bit_buf =
           (uVar12 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar8) <<
           (-(char)this->m_bits_left & 0x1fU);
      this->m_bits_left = this->m_bits_left + 0x10;
    }
    else {
      this->m_bit_buf = uVar6 << 8;
    }
    uVar12 = uVar6 >> 0x18 & 0xf;
    if (3 < uVar12) {
      stop_decoding(this,JPGD_BAD_DQT_TABLE);
    }
    if (this->m_quant[uVar12] == (jpgd_quant_t *)0x0) {
      pjVar7 = (jpgd_quant_t *)alloc(this,0x80,false);
      this->m_quant[uVar12] = pjVar7;
    }
    lVar13 = 0;
    do {
      iVar2 = this->m_bits_left;
      uVar8 = this->m_bit_buf;
      iVar5 = iVar2 + -8;
      this->m_bits_left = iVar5;
      if (iVar2 < 9) {
        this->m_bit_buf = uVar8 << ((byte)iVar2 & 0x1f);
        iVar5 = this->m_in_buf_left;
        if (iVar5 == 0) {
          prep_in_buffer(this);
          iVar5 = this->m_in_buf_left;
          if (iVar5 != 0) goto LAB_0011dab4;
          uVar9 = this->m_tem_flag;
          this->m_tem_flag = uVar9 ^ 1;
          uVar15 = 0xd9;
          if (uVar9 == 0) {
            uVar15 = 0xff;
          }
LAB_0011db0b:
          prep_in_buffer(this);
          iVar5 = this->m_in_buf_left;
          if (iVar5 != 0) {
            pbVar10 = this->m_pIn_buf_ofs;
            goto LAB_0011db28;
          }
          uVar3 = this->m_tem_flag;
          this->m_tem_flag = uVar3 ^ 1;
          uVar9 = 0xd9;
          if (uVar3 == 0) {
            uVar9 = 0xff;
          }
        }
        else {
LAB_0011dab4:
          pbVar4 = this->m_pIn_buf_ofs;
          pbVar10 = pbVar4 + 1;
          this->m_pIn_buf_ofs = pbVar10;
          uVar15 = (uint)*pbVar4;
          iVar5 = iVar5 + -1;
          this->m_in_buf_left = iVar5;
          if (iVar5 == 0) goto LAB_0011db0b;
LAB_0011db28:
          this->m_pIn_buf_ofs = pbVar10 + 1;
          bVar1 = *pbVar10;
          this->m_in_buf_left = iVar5 + -1;
          uVar9 = (uint)bVar1;
        }
        uVar16 = (uVar15 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar9) <<
                 (-(char)this->m_bits_left & 0x1fU);
        this->m_bit_buf = uVar16;
        iVar5 = this->m_bits_left + 0x10;
        this->m_bits_left = iVar5;
      }
      else {
        uVar16 = uVar8 << 8;
        this->m_bit_buf = uVar16;
      }
      uVar11 = (ushort)(byte)(uVar8 >> 0x18);
      if (0xfffffff < uVar6) {
        this->m_bits_left = iVar5 + -8;
        if (iVar5 < 9) {
          this->m_bit_buf = uVar16 << ((byte)iVar5 & 0x1f);
          iVar5 = this->m_in_buf_left;
          if (iVar5 == 0) {
            prep_in_buffer(this);
            iVar5 = this->m_in_buf_left;
            if (iVar5 != 0) goto LAB_0011dbb6;
            uVar9 = this->m_tem_flag;
            this->m_tem_flag = uVar9 ^ 1;
            uVar15 = 0xd9;
            if (uVar9 == 0) {
              uVar15 = 0xff;
            }
LAB_0011dc30:
            prep_in_buffer(this);
            iVar5 = this->m_in_buf_left;
            if (iVar5 != 0) {
              pbVar10 = this->m_pIn_buf_ofs;
              goto LAB_0011dc49;
            }
            uVar3 = this->m_tem_flag;
            this->m_tem_flag = uVar3 ^ 1;
            uVar9 = 0xd9;
            if (uVar3 == 0) {
              uVar9 = 0xff;
            }
          }
          else {
LAB_0011dbb6:
            pbVar4 = this->m_pIn_buf_ofs;
            pbVar10 = pbVar4 + 1;
            this->m_pIn_buf_ofs = pbVar10;
            uVar15 = (uint)*pbVar4;
            iVar5 = iVar5 + -1;
            this->m_in_buf_left = iVar5;
            if (iVar5 == 0) goto LAB_0011dc30;
LAB_0011dc49:
            this->m_pIn_buf_ofs = pbVar10 + 1;
            bVar1 = *pbVar10;
            this->m_in_buf_left = iVar5 + -1;
            uVar9 = (uint)bVar1;
          }
          this->m_bit_buf =
               (uVar15 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar9) <<
               (-(char)this->m_bits_left & 0x1fU);
          this->m_bits_left = this->m_bits_left + 0x10;
        }
        else {
          this->m_bit_buf = uVar16 << 8;
        }
        uVar11 = (ushort)((uVar8 >> 0x18) << 8) | (ushort)(byte)(uVar16 >> 0x18);
      }
      this->m_quant[uVar12][lVar13] = uVar11;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x40);
    uVar6 = (uint)(0xfffffff < uVar6) * 0x40 + 0x41;
    bVar17 = uVar14 < uVar6;
    uVar14 = uVar14 - uVar6;
    if (bVar17) {
      stop_decoding(this,JPGD_BAD_DQT_LENGTH);
    }
  } while( true );
}

Assistant:

void jpeg_decoder::read_dqt_marker() {
  int n, i, prec;
  uint num_left;
  uint temp;

  num_left = get_bits(16);

  if (num_left < 2)
    stop_decoding(JPGD_BAD_DQT_MARKER);

  num_left -= 2;

  while (num_left) {
    n = get_bits(8);
    prec = n >> 4;
    n &= 0x0F;

    if (n >= JPGD_MAX_QUANT_TABLES)
      stop_decoding(JPGD_BAD_DQT_TABLE);

    if (!m_quant[n])
      m_quant[n] = (jpgd_quant_t*)alloc(64 * sizeof(jpgd_quant_t));

    // read quantization entries, in zag order
    for (i = 0; i < 64; i++) {
      temp = get_bits(8);

      if (prec)
        temp = (temp << 8) + get_bits(8);

      m_quant[n][i] = static_cast<jpgd_quant_t>(temp);
    }

    i = 64 + 1;

    if (prec)
      i += 64;

    if (num_left < (uint)i)
      stop_decoding(JPGD_BAD_DQT_LENGTH);

    num_left -= i;
  }
}